

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenUtils.hpp
# Opt level: O2

Index pgi::detail::sample_from_pmf<Eigen::SparseVector<double,0,int>>
                (SparseMatrixBase<Eigen::SparseVector<double,_0,_int>_> *pmf,Scalar *random01)

{
  runtime_error *this;
  Index i;
  long i_00;
  double dVar1;
  Scalar SVar2;
  
  dVar1 = 0.0;
  i_00 = 0;
  while( true ) {
    if (*(long *)(pmf + 0x28) <= i_00) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"failed sampling!");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    SVar2 = Eigen::SparseVector<double,_0,_int>::coeff((SparseVector<double,_0,_int> *)pmf,i_00);
    dVar1 = dVar1 + SVar2;
    if (*random01 <= dVar1) break;
    i_00 = i_00 + 1;
  }
  return i_00;
}

Assistant:

typename Eigen::SparseMatrixBase<Derived>::Index sample_from_pmf(
    const Eigen::SparseMatrixBase<Derived>& pmf,
    const typename Derived::Scalar& random01) {
  typename Derived::Scalar cumulative(0);
  const Derived& mat(pmf.derived());
  for (typename Eigen::SparseMatrixBase<Derived>::Index i = 0; i < pmf.size();
       ++i) {
    cumulative += mat.coeff(i);
    if (cumulative >= random01) return i;
  }
  throw std::runtime_error("failed sampling!");
}